

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_dep_parser.cc
# Opt level: O2

void DepParserTask::get_cost_to_go_losses
               (search *sch,v_array<std::pair<unsigned_int,_float>_> *gold_action_losses,
               uint32_t left_label,uint32_t right_label)

{
  long lVar1;
  void *pvVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  uint32_t i;
  ulong uVar7;
  float fVar8;
  pair<unsigned_int,_float> local_48;
  v_array<std::pair<unsigned_int,_float>_> *local_40;
  uint local_38;
  uint local_34;
  
  pvVar2 = sch->task_data;
  local_40 = gold_action_losses;
  local_38 = left_label;
  local_34 = right_label;
  v_array<std::pair<unsigned_int,_float>_>::clear(gold_action_losses);
  if (*(char *)((long)pvVar2 + 0x2c2) == '\0') {
    for (uVar7 = 1; uVar7 != 4; uVar7 = uVar7 + 1) {
      uVar6 = *(long *)((long)pvVar2 + 0x20) - *(long *)((long)pvVar2 + 0x18) >> 2;
      uVar5 = 0xffffffffffffffff;
      do {
        if (uVar5 - uVar6 == -1) goto LAB_0022dc36;
        lVar1 = uVar5 * 4;
        uVar5 = uVar5 + 1;
      } while (uVar7 != *(uint *)(*(long *)((long)pvVar2 + 0x18) + 4 + lVar1));
      if (uVar5 < uVar6) {
        local_48 = (pair<unsigned_int,_float>)
                   ((ulong)(uint)(float)*(uint *)(*(long *)((long)pvVar2 + 0x38) + uVar7 * 4) <<
                    0x20 | uVar7);
        v_array<std::pair<unsigned_int,_float>_>::push_back(local_40,&local_48);
      }
LAB_0022dc36:
    }
    if (*(int *)((long)pvVar2 + 0x2c4) != 2) {
      return;
    }
    uVar5 = *(long *)((long)pvVar2 + 0x20) - *(long *)((long)pvVar2 + 0x18) >> 2;
    uVar7 = 0xffffffffffffffff;
    do {
      if (uVar7 - uVar5 == -1) {
        return;
      }
      uVar6 = uVar7 + 1;
      lVar1 = uVar7 * 4;
      uVar7 = uVar6;
    } while (*(int *)(*(long *)((long)pvVar2 + 0x18) + 4 + lVar1) != 4);
    if (uVar5 <= uVar6) {
      return;
    }
    local_48 = (pair<unsigned_int,_float>)
               ((ulong)(uint)(float)*(uint *)(*(long *)((long)pvVar2 + 0x38) + 0x10) << 0x20 | 4);
  }
  else {
    uVar5 = *(long *)((long)pvVar2 + 0x20) - *(long *)((long)pvVar2 + 0x18) >> 2;
    uVar7 = 0xffffffffffffffff;
    do {
      if (uVar7 - uVar5 == -1) goto LAB_0022daf2;
      uVar6 = uVar7 + 1;
      lVar1 = uVar7 * 4;
      uVar7 = uVar6;
    } while (*(int *)(*(long *)((long)pvVar2 + 0x18) + 4 + lVar1) != 1);
    if (uVar6 < uVar5) {
      local_48 = (pair<unsigned_int,_float>)
                 (((ulong)(uint)(float)*(uint *)(*(long *)((long)pvVar2 + 0x38) + 4) << 0x20) + 1);
      v_array<std::pair<unsigned_int,_float>_>::push_back(local_40,&local_48);
    }
LAB_0022daf2:
    for (uVar7 = 2; uVar7 != 4; uVar7 = uVar7 + 1) {
      uVar6 = *(long *)((long)pvVar2 + 0x20) - *(long *)((long)pvVar2 + 0x18) >> 2;
      uVar5 = 0xffffffffffffffff;
      do {
        if (uVar5 - uVar6 == -1) goto LAB_0022dbba;
        lVar1 = uVar5 * 4;
        uVar5 = uVar5 + 1;
      } while (uVar7 != *(uint *)(*(long *)((long)pvVar2 + 0x18) + 4 + lVar1));
      if (uVar5 < uVar6) {
        uVar3 = local_34;
        if (uVar7 == 3) {
          uVar3 = local_38;
        }
        uVar4 = 1;
        while (uVar4 <= *(uint *)((long)pvVar2 + 0x10)) {
          if ((*(int *)((long)pvVar2 + 0x2c4) == 2) ||
             (*(ulong *)((long)pvVar2 + 8) != (ulong)uVar4)) {
            fVar8 = 1.0;
            if (uVar4 == uVar3) {
              fVar8 = 0.0;
            }
            local_48.second = (float)*(uint *)(*(long *)((long)pvVar2 + 0x38) + uVar7 * 4) + fVar8;
            local_48.first = uVar4 + *(uint *)((long)pvVar2 + 0x10) * ((int)uVar7 + -2) + 1;
            v_array<std::pair<unsigned_int,_float>_>::push_back(local_40,&local_48);
            uVar4 = uVar4 + 1;
          }
          else {
            uVar4 = uVar4 + 1;
          }
        }
      }
LAB_0022dbba:
    }
    if (*(int *)((long)pvVar2 + 0x2c4) != 2) {
      return;
    }
    uVar5 = *(long *)((long)pvVar2 + 0x20) - *(long *)((long)pvVar2 + 0x18) >> 2;
    uVar7 = 0xffffffffffffffff;
    do {
      if (uVar7 - uVar5 == -1) {
        return;
      }
      uVar6 = uVar7 + 1;
      lVar1 = uVar7 * 4;
      uVar7 = uVar6;
    } while (*(int *)(*(long *)((long)pvVar2 + 0x18) + 4 + lVar1) != 4);
    if (uVar5 <= uVar6) {
      return;
    }
    local_48.second = (float)*(uint *)(*(long *)((long)pvVar2 + 0x38) + 0x10);
    local_48.first = *(int *)((long)pvVar2 + 0x10) * 2 + 2;
  }
  v_array<std::pair<unsigned_int,_float>_>::push_back(local_40,&local_48);
  return;
}

Assistant:

void get_cost_to_go_losses(
    Search::search &sch, v_array<pair<action, float>> &gold_action_losses, uint32_t left_label, uint32_t right_label)
{
  task_data *data = sch.get_task_data<task_data>();
  bool &one_learner = data->one_learner;
  uint32_t &sys = data->transition_system;
  v_array<uint32_t> &action_loss = data->action_loss, &valid_actions = data->valid_actions;
  uint32_t &num_label = data->num_label;
  gold_action_losses.clear();

  if (one_learner)
  {
    if (is_valid(SHIFT, valid_actions))
      gold_action_losses.push_back(make_pair(SHIFT, (float)action_loss[SHIFT]));
    for (uint32_t i = 2; i <= 3; i++)
      if (is_valid(i, valid_actions))
      {
        for (uint32_t j = 1; j <= num_label; j++)
          if (sys == arc_eager || j != data->root_label)
            gold_action_losses.push_back(make_pair((1 + j + (i - 2) * num_label),
                action_loss[i] + (float)(j != (i == REDUCE_LEFT ? left_label : right_label))));
      }
    if (sys == arc_eager && is_valid(REDUCE, valid_actions))
      gold_action_losses.push_back(make_pair(2 + num_label * 2, (float)action_loss[REDUCE]));
  }
  else
  {
    for (action i = 1; i <= 3; i++)
      if (is_valid(i, valid_actions))
        gold_action_losses.push_back(make_pair(i, (float)action_loss[i]));
    if (sys == arc_eager && is_valid(REDUCE, valid_actions))
      gold_action_losses.push_back(make_pair(REDUCE, (float)action_loss[REDUCE]));
  }
}